

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmt_bin_decode.c
# Opt level: O3

void mmt_buf_check_sanity(mmt_buf *buf)

{
  byte bVar1;
  uint32_t uVar2;
  _func_void_mmt_dup_syscall_ptr_void_ptr *p_Var3;
  _func_void_uint8_t_ptr_uint_void_ptr *p_Var4;
  _func_void_mmt_mmap2_ptr_void_ptr *p_Var5;
  _func_void_mmt_mremap_ptr_void_ptr *p_Var6;
  _func_void_mmt_mmap_ptr_void_ptr *p_Var7;
  _func_void_mmt_unmap_ptr_void_ptr *p_Var8;
  _func_void_mmt_sync_ptr_void_ptr *p_Var9;
  uint uVar10;
  byte *pbVar11;
  mmt_dup_syscall *pmVar12;
  void *pvVar13;
  mmt_open *pmVar14;
  mmt_mmap2 *pmVar15;
  mmt_mremap *pmVar16;
  mmt_ioctl_post_v2 *pmVar17;
  _func_void_mmt_ioctl_post_v2_ptr_void_ptr_mmt_memory_dump_ptr_int *p_Var18;
  mmt_mmap *pmVar19;
  mmt_unmap *pmVar20;
  _func_void_mmt_open_ptr_void_ptr *p_Var21;
  mmt_sync *pmVar22;
  char *pcVar23;
  mmt_buf *buf_00;
  void *pvVar24;
  undefined8 *extraout_RDX;
  uint uVar25;
  int iVar26;
  long lVar27;
  mmt_buf **ppmVar28;
  void *in_RSI;
  uint *puVar29;
  uint *puVar30;
  uint uVar31;
  mmt_ioctl_post_v2 *pmStack_238;
  mmt_buf *pmStack_230;
  mmt_memory_dump_v2_prefix *pmStack_228;
  mmt_memory_dump amStack_220 [20];
  
  if (buf->len < 0x10000) {
    return;
  }
  mmt_buf_check_sanity_cold_1();
  puVar29 = (uint *)0x0;
  pbVar11 = (byte *)mmt_load_data_with_prefix(1,0,1);
  if (pbVar11 != (byte *)0x0) {
    do {
      bVar1 = *pbVar11;
      puVar30 = puVar29;
      if (bVar1 < 0x53) {
        if (bVar1 < 0x4d) {
          if ((bVar1 != 0x2d) && (bVar1 != 0x3d)) goto switchD_0010239a_caseD_66;
          uVar25 = 1;
          while (mmt_buf[(uVar25 + mmt_idx) - 1] != '\n') {
            pvVar13 = mmt_load_data_with_prefix(uVar25,0,0);
            uVar25 = uVar25 + 1;
            if (pvVar13 == (void *)0x0) {
              return;
            }
          }
          p_Var4 = (((mmt_nvidia_decode_funcs *)buf)->base).msg;
          if (p_Var4 != (_func_void_uint8_t_ptr_uint_void_ptr *)0x0) {
            (*p_Var4)(mmt_buf + mmt_idx,uVar25 - 1,in_RSI);
          }
          mmt_idx = mmt_idx + uVar25;
        }
        else {
          if (bVar1 != 0x4d) {
            if (bVar1 != 0x52) goto switchD_0010239a_caseD_66;
            pvVar13 = mmt_load_data_with_prefix(0xb,0,0);
            uVar25 = *(byte *)((long)pvVar13 + 9) + 0xb;
            pmVar14 = (mmt_open *)mmt_load_data_with_prefix(uVar25,0,0);
            mmt_check_eor(uVar25);
            p_Var21 = (_func_void_mmt_open_ptr_void_ptr *)
                      (((mmt_nvidia_decode_funcs *)buf)->base).memread2;
            goto LAB_0010282b;
          }
          pmVar15 = (mmt_mmap2 *)mmt_load_data_with_prefix(0x2a,0,0);
          mmt_check_eor(0x2a);
          p_Var5 = (((mmt_nvidia_decode_funcs *)buf)->base).mmap2;
          if (p_Var5 != (_func_void_mmt_mmap2_ptr_void_ptr *)0x0) {
            (*p_Var5)(pmVar15,in_RSI);
          }
          mmt_idx = mmt_idx + 0x2a;
        }
        goto LAB_00102845;
      }
      puVar30 = &switchD_0010239a::switchdataD_0010499c;
      switch(bVar1) {
      case 100:
        pmVar12 = (mmt_dup_syscall *)mmt_load_data_with_prefix(10,0,0);
        mmt_check_eor(10);
        p_Var3 = (((mmt_nvidia_decode_funcs *)buf)->base).dup_syscall;
        if (p_Var3 != (_func_void_mmt_dup_syscall_ptr_void_ptr *)0x0) {
          (*p_Var3)(pmVar12,in_RSI);
        }
        mmt_idx = mmt_idx + 10;
        break;
      case 0x65:
        pmVar16 = (mmt_mremap *)mmt_load_data_with_prefix(0x3e,0,0);
        mmt_check_eor(0x3e);
        p_Var6 = (((mmt_nvidia_decode_funcs *)buf)->base).mremap;
        if (p_Var6 != (_func_void_mmt_mremap_ptr_void_ptr *)0x0) {
          (*p_Var6)(pmVar16,in_RSI);
        }
        mmt_idx = mmt_idx + 0x3e;
        break;
      case 0x66:
      case 0x67:
      case 0x68:
      case 0x6b:
      case 0x6c:
      case 0x70:
      case 0x71:
      case 0x73:
      case 0x76:
switchD_0010239a_caseD_66:
        mmt_decode_cold_1();
        puVar30[0] = 0;
        puVar30[1] = 0;
        *extraout_RDX = 0;
        uVar25 = (uint)pbVar11;
        pcVar23 = (char *)mmt_load_data_with_prefix(1,uVar25,1);
        if ((pcVar23 != (char *)0x0) && (*pcVar23 == 'y')) {
          pvVar13 = mmt_load_data_with_prefix(9,uVar25,0);
          buf_00 = (mmt_buf *)mmt_load_data_with_prefix(4,uVar25 + 9,0);
          mmt_buf_check_sanity(buf_00);
          uVar2 = buf_00->len;
          pvVar24 = mmt_load_data_with_prefix(uVar2 + 5,uVar25 + 9,0);
          mmt_check_eor(uVar25 + uVar2 + 0xe);
          *(void **)puVar30 = pvVar13;
          *extraout_RDX = pvVar24;
        }
        return;
      case 0x69:
        do {
          pvVar13 = mmt_load_data_with_prefix(0xe,0,0);
          mmt_buf_check_sanity((mmt_buf *)((long)pvVar13 + 9));
          uVar31 = *(int *)((long)pvVar13 + 9) + 0xe;
          pmStack_238 = (mmt_ioctl_post_v2 *)mmt_load_data_with_prefix(uVar31,0,0);
          mmt_check_eor(uVar31);
          ppmVar28 = &amStack_220[0].data;
          lVar27 = 0;
          uVar25 = uVar31;
          do {
            uVar10 = load_memory_dump_v2(uVar25,&pmStack_228,&pmStack_230);
            if (uVar10 == 0) goto LAB_0010263f;
            ((mmt_memory_dump *)(ppmVar28 + -2))->addr = pmStack_228->addr;
            *ppmVar28 = pmStack_230;
            ppmVar28[-1] = (mmt_buf *)0x0;
            lVar27 = lVar27 + 1;
            uVar25 = uVar25 + uVar10;
            ppmVar28 = ppmVar28 + 3;
          } while (lVar27 != 0x14);
          lVar27 = 0x14;
LAB_0010263f:
          iVar26 = (int)lVar27;
          pmVar17 = (mmt_ioctl_post_v2 *)mmt_load_data_with_prefix(uVar31,0,0);
        } while (pmStack_238 != pmVar17);
        p_Var18 = (_func_void_mmt_ioctl_post_v2_ptr_void_ptr_mmt_memory_dump_ptr_int *)
                  (((mmt_nvidia_decode_funcs *)buf)->base).ioctl_pre;
        goto LAB_0010275c;
      case 0x6a:
        do {
          pvVar13 = mmt_load_data_with_prefix(0x1e,0,0);
          mmt_buf_check_sanity((mmt_buf *)((long)pvVar13 + 0x19));
          uVar31 = *(int *)((long)pvVar13 + 0x19) + 0x1e;
          pmStack_238 = (mmt_ioctl_post_v2 *)mmt_load_data_with_prefix(uVar31,0,0);
          mmt_check_eor(uVar31);
          ppmVar28 = &amStack_220[0].data;
          lVar27 = 0;
          uVar25 = uVar31;
          do {
            uVar10 = load_memory_dump_v2(uVar25,&pmStack_228,&pmStack_230);
            if (uVar10 == 0) goto LAB_00102739;
            ((mmt_memory_dump *)(ppmVar28 + -2))->addr = pmStack_228->addr;
            *ppmVar28 = pmStack_230;
            ppmVar28[-1] = (mmt_buf *)0x0;
            lVar27 = lVar27 + 1;
            uVar25 = uVar25 + uVar10;
            ppmVar28 = ppmVar28 + 3;
          } while (lVar27 != 0x14);
          lVar27 = 0x14;
LAB_00102739:
          iVar26 = (int)lVar27;
          pmVar17 = (mmt_ioctl_post_v2 *)mmt_load_data_with_prefix(uVar31,0,0);
        } while (pmStack_238 != pmVar17);
        p_Var18 = (((mmt_nvidia_decode_funcs *)buf)->base).ioctl_post;
LAB_0010275c:
        if (p_Var18 != (_func_void_mmt_ioctl_post_v2_ptr_void_ptr_mmt_memory_dump_ptr_int *)0x0) {
          (*p_Var18)(pmStack_238,in_RSI,amStack_220,iVar26);
        }
        mmt_idx = mmt_idx + uVar25;
        break;
      case 0x6d:
        pmVar19 = (mmt_mmap *)mmt_load_data_with_prefix(0x1e,0,0);
        mmt_check_eor(0x1e);
        p_Var7 = (((mmt_nvidia_decode_funcs *)buf)->base).mmap;
        if (p_Var7 != (_func_void_mmt_mmap_ptr_void_ptr *)0x0) {
          (*p_Var7)(pmVar19,in_RSI);
        }
        mmt_idx = mmt_idx + 0x1e;
        break;
      case 0x6e:
        mmt_decode_nvidia((mmt_nvidia_decode_funcs *)buf,in_RSI);
        break;
      case 0x6f:
        pvVar13 = mmt_load_data_with_prefix(0x12,0,0);
        mmt_buf_check_sanity((mmt_buf *)((long)pvVar13 + 0xd));
        uVar25 = *(int *)((long)pvVar13 + 0xd) + 0x12;
        pmVar14 = (mmt_open *)mmt_load_data_with_prefix(uVar25,0,0);
        mmt_check_eor(uVar25);
        p_Var21 = (((mmt_nvidia_decode_funcs *)buf)->base).open;
        goto LAB_0010282b;
      case 0x72:
        pvVar13 = mmt_load_data_with_prefix(0xb,0,0);
        uVar25 = *(byte *)((long)pvVar13 + 9) + 0xb;
        pmVar14 = (mmt_open *)mmt_load_data_with_prefix(uVar25,0,0);
        mmt_check_eor(uVar25);
        p_Var21 = (_func_void_mmt_open_ptr_void_ptr *)
                  (((mmt_nvidia_decode_funcs *)buf)->base).memread;
        goto LAB_0010282b;
      case 0x74:
        pvVar13 = mmt_load_data_with_prefix(10,0,0);
        mmt_buf_check_sanity((mmt_buf *)((long)pvVar13 + 5));
        uVar25 = *(int *)((long)pvVar13 + 5) + 10;
        pmVar14 = (mmt_open *)mmt_load_data_with_prefix(uVar25,0,0);
        mmt_check_eor(uVar25);
        p_Var21 = (_func_void_mmt_open_ptr_void_ptr *)
                  (((mmt_nvidia_decode_funcs *)buf)->base).write_syscall;
        goto LAB_0010282b;
      case 0x75:
        pmVar20 = (mmt_unmap *)mmt_load_data_with_prefix(0x2e,0,0);
        mmt_check_eor(0x2e);
        p_Var8 = (((mmt_nvidia_decode_funcs *)buf)->base).munmap;
        if (p_Var8 != (_func_void_mmt_unmap_ptr_void_ptr *)0x0) {
          (*p_Var8)(pmVar20,in_RSI);
        }
        mmt_idx = mmt_idx + 0x2e;
        break;
      case 0x77:
        pvVar13 = mmt_load_data_with_prefix(0xb,0,0);
        uVar25 = *(byte *)((long)pvVar13 + 9) + 0xb;
        pmVar14 = (mmt_open *)mmt_load_data_with_prefix(uVar25,0,0);
        mmt_check_eor(uVar25);
        p_Var21 = (_func_void_mmt_open_ptr_void_ptr *)
                  (((mmt_nvidia_decode_funcs *)buf)->base).memwrite;
LAB_0010282b:
        if (p_Var21 != (_func_void_mmt_open_ptr_void_ptr *)0x0) {
          (*p_Var21)(pmVar14,in_RSI);
        }
        mmt_idx = mmt_idx + uVar25;
        break;
      default:
        if (bVar1 != 0x53) {
          puVar30 = puVar29;
          if (bVar1 != 0x57) goto switchD_0010239a_caseD_66;
          pvVar13 = mmt_load_data_with_prefix(0xb,0,0);
          uVar25 = *(byte *)((long)pvVar13 + 9) + 0xb;
          pmVar14 = (mmt_open *)mmt_load_data_with_prefix(uVar25,0,0);
          mmt_check_eor(uVar25);
          p_Var21 = (_func_void_mmt_open_ptr_void_ptr *)
                    (((mmt_nvidia_decode_funcs *)buf)->base).memwrite2;
          goto LAB_0010282b;
        }
        pmVar22 = (mmt_sync *)mmt_load_data_with_prefix(6,0,0);
        mmt_check_eor(6);
        p_Var9 = (((mmt_nvidia_decode_funcs *)buf)->base).sync;
        if (p_Var9 != (_func_void_mmt_sync_ptr_void_ptr *)0x0) {
          (*p_Var9)(pmVar22,in_RSI);
        }
        mmt_idx = mmt_idx + 6;
      }
LAB_00102845:
      puVar29 = (uint *)0x0;
      pbVar11 = (byte *)mmt_load_data_with_prefix(1,0,1);
    } while (pbVar11 != (byte *)0x0);
  }
  return;
}

Assistant:

void mmt_buf_check_sanity(struct mmt_buf *buf)
{
	if (buf->len < MMT_BUF_SIZE)
		return;

	fflush(stdout);
	fprintf(stderr, "buffer too long: %u\n", buf->len);
	fflush(stderr);
	exit(1);
}